

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::binary::writer<std::wostream>
          (binary *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  int line;
  byte *pbVar7;
  byte *pbVar8;
  char *str;
  back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
  local_c0;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *local_b8;
  byte *local_b0;
  long local_a8;
  long local_a0;
  byte *local_98;
  accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> acc;
  
  acc.chars_to_reserve_ = ind->count_ * 0x32 + 0xfd2;
  acc.os_ = os;
  indent::str<wchar_t>(&acc.indent_string_,ind);
  acc.lines_._M_dataplus._M_p = (pointer)&acc.lines_.field_2;
  acc.width_ = 0;
  acc.line_count_ = 0;
  acc.lines_._M_string_length = 0;
  acc.lines_.field_2._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)&acc.lines_);
  local_b8 = os;
  std::operator<<(os,"!!binary |\n");
  puVar4 = (this->v_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_b0 = (this->v_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_a8 = (long)local_b0 - (long)puVar4;
  lVar5 = local_a8 / 3;
  local_a8 = local_a8 % 3;
  lVar6 = 0;
  if (0 < lVar5) {
    lVar6 = lVar5;
  }
  pbVar7 = puVar4 + 1;
  while (lVar6 != 0) {
    bVar1 = pbVar7[-1];
    bVar2 = *pbVar7;
    bVar3 = pbVar7[1];
    local_c0.container = &acc;
    local_a0 = lVar6 + -1;
    local_98 = pbVar7;
    std::
    back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::operator=(&local_c0,
                to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                ::alphabet + (bVar1 >> 2));
    local_c0.container = &acc;
    std::
    back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::operator=(&local_c0,
                to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                ::alphabet + (((uint)bVar1 << 0x10 | (uint)bVar2 << 8) >> 0xc & 0x3f));
    local_c0.container = &acc;
    std::
    back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::operator=(&local_c0,
                to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                ::alphabet + ((ushort)(CONCAT11(bVar2,bVar3) >> 6) & 0x3f));
    local_c0.container = &acc;
    std::
    back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::operator=(&local_c0,
                to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                ::alphabet + (bVar3 & 0x3f));
    pbVar7 = local_98 + 3;
    lVar6 = local_a0;
  }
  if (local_a8 == 2) {
    bVar1 = pbVar7[-1];
    bVar2 = *pbVar7;
    local_c0.container = &acc;
    std::
    back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::operator=(&local_c0,
                to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                ::alphabet + (bVar1 >> 2));
    local_c0.container = &acc;
    std::
    back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::operator=(&local_c0,
                to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                ::alphabet + (((uint)bVar1 << 0x10 | (uint)bVar2 << 8) >> 0xc & 0x3f));
    local_c0.container = &acc;
    std::
    back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::operator=(&local_c0,
                to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                ::alphabet + (ulong)(bVar2 & 0xf) * 4);
    pbVar8 = pbVar7 + 1;
LAB_001226dd:
    anon_unknown.dwarf_b9def::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>
    ::push_back(&acc,'=');
  }
  else {
    pbVar8 = pbVar7 + -1;
    if (local_a8 == 1) {
      bVar1 = *pbVar8;
      local_c0.container = &acc;
      std::
      back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ::operator=(&local_c0,
                  to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                  ::alphabet + (bVar1 >> 2));
      local_c0.container = &acc;
      std::
      back_insert_iterator<(anonymous_namespace)::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ::operator=(&local_c0,
                  to_base64<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>>(__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<(anonymous_namespace)::accumulator<std::wostream>>)
                  ::alphabet + ((bVar1 & 3) << 4));
      anon_unknown.dwarf_b9def::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back(&acc,'=');
      pbVar8 = pbVar7;
      goto LAB_001226dd;
    }
    if (local_a8 != 0) {
      line = 0x4e;
      str = "false";
      goto LAB_00122745;
    }
  }
  if (pbVar8 == local_b0) {
    std::operator<<(acc.os_,(wstring *)&acc.lines_);
    acc.lines_._M_string_length = 0;
    acc.width_ = 0;
    acc.line_count_ = 0;
    *acc.lines_._M_dataplus._M_p = L'\0';
    anon_unknown.dwarf_b9def::accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>
    ::~accumulator(&acc);
    return local_b8;
  }
  line = 0x51;
  str = "first == last";
LAB_00122745:
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                ,line);
}

Assistant:

OStream & binary::writer (OStream & os, indent const & ind) const {
            accumulator<OStream> acc (os, ind);
            os << "!!binary |\n";
            to_base64 (std::begin (v_), std::end (v_), std::back_inserter (acc));
            acc.flush ();
            return os;
        }